

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.h
# Opt level: O1

void __thiscall bsim::bit_vector<17>::bit_vector(bit_vector<17> *this,string *str)

{
  int i;
  long lVar1;
  ulong uVar2;
  
  if (str->_M_string_length == 0x11) {
    lVar1 = 0x10;
    uVar2 = 0;
    do {
      this->bits[uVar2 >> 3] =
           '\x01' << ((byte)uVar2 & 7) &
           (-((str->_M_dataplus)._M_p[lVar1] != '0') ^ this->bits[uVar2 >> 3]) ^
           this->bits[uVar2 >> 3];
      lVar1 = lVar1 + -1;
      uVar2 = uVar2 + 1;
    } while (uVar2 != 0x11);
    return;
  }
  __assert_fail("str.size() == N",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/bit_vector.h"
                ,0x26,"bsim::bit_vector<17>::bit_vector(const std::string &) [N = 17]");
}

Assistant:

bit_vector(const std::string& str) {
      assert(str.size() == N);

      for (int i = N - 1; i >= 0; i--) {
	unsigned char val = (str[i] == '0') ? 0 : 1;
	int ind = N - i - 1;
	set(ind, val);
      }
    }